

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::UninterpretedOption::_InternalSerialize
          (UninterpretedOption *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  ulong uVar2;
  anon_union_80_1_493b367e_for_UninterpretedOption_3 aVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>_>
  *value;
  uint8_t *puVar4;
  int index;
  char *in_R9;
  undefined8 *puVar5;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view field_name;
  string_view field_name_00;
  
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  for (index = 0; iVar1 != index; index = index + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                      (&(this->field_0)._impl_.name_.super_RepeatedPtrFieldBase,index);
    target = internal::WireFormatLite::InternalWriteMessage
                       (2,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  aVar3 = this->field_0;
  if (((undefined1  [80])aVar3 & (undefined1  [80])0x1) != (undefined1  [80])0x0) {
    puVar5 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.identifier_value_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
    ;
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"google.protobuf.UninterpretedOption.identifier_value";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar5,(char *)(ulong)*(uint *)(puVar5 + 1),1,0x34,field_name);
    s._M_str = (char *)*puVar5;
    s._M_len = puVar5[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,3,s,target);
  }
  if (((undefined1  [80])aVar3 & (undefined1  [80])0x8) != (undefined1  [80])0x0) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = internal::WireFormatLite::WriteUInt64ToArray
                       (4,(this->field_0)._impl_.positive_int_value_,puVar4);
  }
  if (((undefined1  [80])aVar3 & (undefined1  [80])0x10) != (undefined1  [80])0x0) {
    target = internal::WireFormatLite::WriteInt64ToArrayWithField<5>
                       (stream,(this->field_0)._impl_.negative_int_value_,target);
  }
  if (((undefined1  [80])aVar3 & (undefined1  [80])0x20) != (undefined1  [80])0x0) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = internal::WireFormatLite::WriteDoubleToArray
                       (6,(this->field_0)._impl_.double_value_,puVar4);
  }
  if (((undefined1  [80])aVar3 & (undefined1  [80])0x2) != (undefined1  [80])0x0) {
    puVar5 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.string_value_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    s_00._M_str = (char *)*puVar5;
    s_00._M_len = puVar5[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,7,s_00,target);
  }
  if (((undefined1  [80])aVar3 & (undefined1  [80])0x4) != (undefined1  [80])0x0) {
    puVar5 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.aggregate_value_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name_00._M_str = in_R9;
    field_name_00._M_len = (size_t)"google.protobuf.UninterpretedOption.aggregate_value";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar5,(char *)(ulong)*(uint *)(puVar5 + 1),1,0x33,field_name_00);
    s_01._M_str = (char *)*puVar5;
    s_01._M_len = puVar5[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,8,s_01,target);
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return target;
  }
  puVar4 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar4;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL UninterpretedOption::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const UninterpretedOption& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.UninterpretedOption)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_name_size());
       i < n; i++) {
    const auto& repfield = this_._internal_name().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            2, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string identifier_value = 3;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_identifier_value();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.UninterpretedOption.identifier_value");
    target = stream->WriteStringMaybeAliased(3, _s, target);
  }

  // optional uint64 positive_int_value = 4;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt64ToArray(
        4, this_._internal_positive_int_value(), target);
  }

  // optional int64 negative_int_value = 5;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<5>(
            stream, this_._internal_negative_int_value(), target);
  }

  // optional double double_value = 6;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteDoubleToArray(
        6, this_._internal_double_value(), target);
  }

  // optional bytes string_value = 7;
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::std::string& _s = this_._internal_string_value();
    target = stream->WriteBytesMaybeAliased(7, _s, target);
  }

  // optional string aggregate_value = 8;
  if ((cached_has_bits & 0x00000004u) != 0) {
    const ::std::string& _s = this_._internal_aggregate_value();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.UninterpretedOption.aggregate_value");
    target = stream->WriteStringMaybeAliased(8, _s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.UninterpretedOption)
  return target;
}